

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_SetInitValue(Abc_Obj_t *pObj,int val,int dc)

{
  Flow_Data_t *pFVar1;
  uint uVar2;
  int dc_local;
  int val_local;
  Abc_Obj_t *pObj_local;
  
  pFVar1 = pManMR->pDataArray;
  uVar2 = Abc_ObjId(pObj);
  *(ushort *)(pFVar1 + uVar2) = *(ushort *)(pFVar1 + uVar2) & 0xff9f;
  if (dc == 0) {
    if (val == 0) {
      pFVar1 = pManMR->pDataArray;
      uVar2 = Abc_ObjId(pObj);
      *(ushort *)(pFVar1 + uVar2) = *(ushort *)(pFVar1 + uVar2) | 0x20;
    }
    else {
      pFVar1 = pManMR->pDataArray;
      uVar2 = Abc_ObjId(pObj);
      *(ushort *)(pFVar1 + uVar2) = *(ushort *)(pFVar1 + uVar2) | 0x40;
    }
  }
  return;
}

Assistant:

static inline void Abc_FlowRetime_SetInitValue( Abc_Obj_t * pObj,
                                                int val, int dc ) {
  
  // store init value
  FUNSET(pObj, INIT_CARE);
  if (!dc){
    if (val) {
      FSET(pObj, INIT_1);
    } else {
      FSET(pObj, INIT_0);
    }
  }
}